

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

void __thiscall
QStringBuilder<QByteArray,_QByteArray>::~QStringBuilder
          (QStringBuilder<QByteArray,_QByteArray> *this)

{
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->b).d);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)this);
  return;
}

Assistant:

~QStringBuilder() = default;